

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void shunt_map_up_right(tgestate_t *state)

{
  long in_RDI;
  tgestate_t *in_stack_00000010;
  
  *(char *)(in_RDI + 0x691) = *(char *)(in_RDI + 0x691) + -1;
  *(char *)(in_RDI + 0x692) = *(char *)(in_RDI + 0x692) + '\x01';
  get_supertiles(in_stack_00000010);
  memmove((void *)(*(long *)(in_RDI + 0x790) + 1),(void *)(*(long *)(in_RDI + 0x790) + 0x18),0x180);
  memmove((void *)(*(long *)(in_RDI + 0x7a0) + 1),(void *)(*(long *)(in_RDI + 0x7a0) + 0xc0),0xc00);
  plot_bottommost_tiles(in_stack_00000010);
  plot_leftmost_tiles(in_stack_00000010);
  return;
}

Assistant:

void shunt_map_up_right(tgestate_t *state)
{
  assert(state != NULL);

  /* Conv: The original code has a copy of map_position in HL on entry. In
   * this version we read it from source. */
  state->map_position.x--;
  state->map_position.y++;

  get_supertiles(state);

  memmove(&state->tile_buf[1], &state->tile_buf[24], TILE_BUF_LENGTH - 24);
  memmove(&state->window_buf[1], &state->window_buf[24 * 8], WINDOW_BUF_LENGTH - 24 * 8);

  plot_bottommost_tiles(state);
  plot_leftmost_tiles(state);
}